

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

int Vta_ManObjIsUsed(Vta_Man_t *p,int iObj)

{
  int *piVar1;
  uint *pInfo;
  int i;
  int iObj_local;
  Vta_Man_t *p_local;
  
  piVar1 = Vec_IntEntryP(p->vSeens,p->nWords * iObj);
  pInfo._0_4_ = 0;
  while( true ) {
    if (p->nWords <= (int)pInfo) {
      return 0;
    }
    if (piVar1[(int)pInfo] != 0) break;
    pInfo._0_4_ = (int)pInfo + 1;
  }
  return 1;
}

Assistant:

int Vta_ManObjIsUsed( Vta_Man_t * p, int iObj )
{
    int i;
    unsigned * pInfo = (unsigned *)Vec_IntEntryP( p->vSeens, p->nWords * iObj );
    for ( i = 0; i < p->nWords; i++ )
        if ( pInfo[i] )
            return 1;
    return 0;
}